

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

uint borg_guess_race_name(char *who)

{
  bool bVar1;
  monster_race *pmVar2;
  char **ppcVar3;
  uint *puVar4;
  int *piVar5;
  _Bool _Var6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  wchar_t wVar12;
  uint uVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  char partial [160];
  int local_e4;
  char local_d8 [168];
  
  sVar8 = strlen(who);
  ppcVar3 = borg_unique_text;
  uVar18 = 0;
  wVar15 = borg_unique_size;
  if (L'\x01' < borg_unique_size) {
    do {
      wVar12 = ((int)uVar18 + wVar15) / 2;
      iVar7 = strcmp(ppcVar3[wVar12],who);
      if (iVar7 < 1) {
        uVar18 = (ulong)(uint)wVar12;
        wVar12 = wVar15;
      }
      wVar15 = wVar12;
    } while ((int)uVar18 < wVar15 + L'\xffffffff');
    uVar18 = (ulong)(int)uVar18;
  }
  iVar7 = strcmp(who,ppcVar3[uVar18]);
  if (iVar7 == 0) {
    return borg_unique_what[uVar18];
  }
  _Var6 = suffix(who," (offscreen)");
  pcVar11 = who;
  if (_Var6) {
    pcVar11 = local_d8;
    my_strcpy(pcVar11,who,0xa0);
    local_d8[(int)sVar8 + -0xc] = '\0';
    pcVar9 = format("# Handling offscreen monster (%s)",pcVar11);
    borg_note(pcVar9);
  }
  _Var6 = prefix(pcVar11,"The ");
  if ((!_Var6) && (_Var6 = prefix(pcVar11,"the "), !_Var6)) {
    pcVar9 = "# Assuming player ghost (%s) (a)";
    goto LAB_00219eaa;
  }
  ppcVar3 = borg_normal_text;
  pcVar11 = pcVar11 + 4;
  local_e4 = 0;
  wVar12 = L'\0';
  wVar15 = borg_normal_size;
  if (borg_normal_size < L'\x02') {
LAB_00219dfc:
    piVar5 = borg.trait;
    puVar4 = borg_normal_what;
    ppcVar3 = borg_normal_text;
    pmVar2 = r_info;
    uVar13 = 0;
    lVar16 = (ulong)(uint)wVar12 + 1;
    do {
      iVar7 = strcmp(pcVar11,ppcVar3[lVar16 + -1]);
      if (iVar7 != 0) break;
      iVar10 = pmVar2[(int)puVar4[lVar16 + -1]].level - piVar5[0x69];
      iVar7 = -iVar10;
      if (0 < iVar10) {
        iVar7 = iVar10;
      }
      if (uVar13 == 0 || local_e4 <= 1000 - iVar7) {
        uVar13 = puVar4[lVar16 + -1];
        local_e4 = 1000 - iVar7;
      }
      lVar17 = lVar16 + -1;
      bVar1 = 0 < lVar16;
      lVar16 = lVar17;
    } while (lVar17 != 0 && bVar1);
    if (uVar13 != 0) {
      return uVar13;
    }
  }
  else {
    do {
      wVar14 = (wVar15 + wVar12) / 2;
      iVar7 = strcmp(ppcVar3[wVar14],pcVar11);
      if (iVar7 < 1) {
        wVar12 = wVar14;
        wVar14 = wVar15;
      }
      wVar15 = wVar14;
    } while (wVar12 < wVar14 + L'\xffffffff');
    if (L'\xffffffff' < wVar12) goto LAB_00219dfc;
  }
  pcVar9 = "# Assuming player ghost (%s)(b)";
LAB_00219eaa:
  pcVar11 = format(pcVar9,pcVar11);
  borg_note(pcVar11);
  return z_info->r_max - 1;
}

Assistant:

static unsigned int borg_guess_race_name(char *who)
{
    int k, m, n;

    int i, b_i = 0;
    int s, b_s = 0;

    struct monster_race *r_ptr;

    char partial[160];
    int  len = strlen(who);

    /* Start the search */
    m = 0;
    n = borg_unique_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_unique_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Check for equality */
    if (streq(who, borg_unique_text[m])) {
        /* Use this monster */
        return (borg_unique_what[m]);
    }

    /* Hack -- handle "offscreen" */
    if (suffix(who, " (offscreen)")) {
        /* Remove the suffix */
        my_strcpy(partial, who, sizeof(partial));
        partial[len - 12] = '\0';
        who               = partial;

        /* Message */
        borg_note(format("# Handling offscreen monster (%s)", who));
    }

    /* Assume player ghost */
    if (!prefix(who, "The ") && !prefix(who, "the ")) {
        /* Message */
        borg_note(format("# Assuming player ghost (%s) (a)", who));

        /* Oops */
        return (z_info->r_max - 1);
    }

    /* Skip the prefix */
    who += 4;

    /* Start the search */
    m = 0;
    n = borg_normal_size;

    /* Binary search */
    while (m < n - 1) {
        /* Pick a "middle" entry */
        i = (m + n) / 2;

        /* Search to the right (or here) */
        if (strcmp(borg_normal_text[i], who) <= 0) {
            m = i;
        }

        /* Search to the left */
        else {
            n = i;
        }
    }

    /* Scan possibilities */
    for (k = m; k >= 0; k--) {
        /* Stop when done */
        if (!streq(who, borg_normal_text[k]))
            break;

        /* Extract the monster */
        i = (int)borg_normal_what[k];

        /* Access the monster */
        r_ptr = &r_info[i];

        /* Basic score */
        s = 1000;

        /* Penalize "depth miss" */
        s = s - ABS(r_ptr->level - borg.trait[BI_CDEPTH]);

        /* Track best */
        if (b_i && (s < b_s))
            continue;

        /* Track it */
        b_i = i;
        b_s = s;
    }

    /* Success */
    if (b_i)
        return ((unsigned int)b_i);

    /* No match found */
    borg_note(format("# Assuming player ghost (%s)(b)", who));

    /* Oops */
    return (z_info->r_max - 1);
}